

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void __thiscall
pod_vector<unsafe_pod_vector<IsoSpec::ProbAndConfPtr>_>::pod_vector
          (pod_vector<unsafe_pod_vector<IsoSpec::ProbAndConfPtr>_> *this,size_t initial_size)

{
  unsafe_pod_vector<IsoSpec::ProbAndConfPtr> *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (unsafe_pod_vector<IsoSpec::ProbAndConfPtr> *)malloc(initial_size * 0x18);
  this->store = puVar1;
  if (puVar1 != (unsafe_pod_vector<IsoSpec::ProbAndConfPtr> *)0x0) {
    this->first_free = puVar1;
    this->backend_past_end = puVar1 + initial_size;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = operator_new;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

explicit pod_vector(size_t initial_size = 16)
    {
    #if !ISOSPEC_BUILDING_R
        static_assert(std::is_trivially_copyable<T>::value, "Cannot use a pod_vector with a non-Plain Old Data type.");
    #endif

        store = reinterpret_cast<T*>(malloc(sizeof(T) * initial_size));
        if(store == NULL)
            throw std::bad_alloc();
        first_free = store;
        backend_past_end = store + initial_size;
    }